

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPLYImportExport.cpp
# Opt level: O2

void __thiscall
utPLYImportExport_vertexColorTest_Test::TestBody(utPLYImportExport_vertexColorTest_Test *this)

{
  char *pcVar1;
  AssertHelper local_48;
  AssertionResult gtest_ar_4;
  AssertHelper local_30;
  aiFace first_face;
  aiScene *scene;
  Importer importer;
  
  Assimp::Importer::Importer(&importer);
  scene = Assimp::Importer::ReadFile
                    (&importer,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/PLY/float-color.ply"
                     ,0x400);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_7_ = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&first_face,"nullptr","scene",(void **)&gtest_ar_4,&scene);
  if ((char)first_face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (first_face.mIndices == (uint *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)first_face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x84,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&first_face.mIndices);
  gtest_ar_4._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&first_face,"1u","scene->mMeshes[0]->mNumFaces",(uint *)&gtest_ar_4,
             &(*scene->mMeshes)->mNumFaces);
  if ((char)first_face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (first_face.mIndices == (uint *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)first_face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x85,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&first_face.mIndices);
  gtest_ar_4._0_4_ = 4;
  testing::internal::CmpHelperEQ<aiPrimitiveType,unsigned_int>
            ((internal *)&first_face,"aiPrimitiveType_TRIANGLE","scene->mMeshes[0]->mPrimitiveTypes"
             ,(aiPrimitiveType *)&gtest_ar_4,&(*scene->mMeshes)->mPrimitiveTypes);
  if ((char)first_face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (first_face.mIndices == (uint *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)first_face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x86,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&first_face.mIndices);
  gtest_ar_4.success_ = true;
  local_48.data_._0_4_ =
       CONCAT31(local_48.data_._1_3_,
                (*scene->mMeshes)->mNumVertices != 0 &&
                (*scene->mMeshes)->mColors[0] != (aiColor4D *)0x0);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&first_face,"true","scene->mMeshes[0]->HasVertexColors(0)",
             &gtest_ar_4.success_,(bool *)&local_48);
  if ((char)first_face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (first_face.mIndices == (uint *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)first_face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x87,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&first_face.mIndices);
  aiFace::aiFace(&first_face,(*scene->mMeshes)->mFaces);
  local_48.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_4,"3u","first_face.mNumIndices",(uint *)&local_48,
             &first_face.mNumIndices);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x8a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_48.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_4,"0u","first_face.mIndices[0]",(uint *)&local_48,
             first_face.mIndices);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x8b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_48.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_4,"1u","first_face.mIndices[1]",(uint *)&local_48,
             first_face.mIndices + 1);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x8c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_48.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_4,"2u","first_face.mIndices[2]",(uint *)&local_48,
             first_face.mIndices + 2);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x8d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  aiFace::~aiFace(&first_face);
  Assimp::Importer::~Importer(&importer);
  return;
}

Assistant:

TEST_F( utPLYImportExport, vertexColorTest ) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/PLY/float-color.ply", aiProcess_ValidateDataStructure);
    EXPECT_NE( nullptr, scene );
    EXPECT_EQ(1u, scene->mMeshes[0]->mNumFaces);
    EXPECT_EQ(aiPrimitiveType_TRIANGLE, scene->mMeshes[0]->mPrimitiveTypes);
    EXPECT_EQ(true, scene->mMeshes[0]->HasVertexColors(0));

    auto first_face = scene->mMeshes[0]->mFaces[0];
    EXPECT_EQ(3u, first_face.mNumIndices);
    EXPECT_EQ(0u, first_face.mIndices[0]);
    EXPECT_EQ(1u, first_face.mIndices[1]);
    EXPECT_EQ(2u, first_face.mIndices[2]);
}